

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

void luaX_init(lua_State *L)

{
  TString *pTVar1;
  TString *ts;
  TString *e;
  int i;
  lua_State *L_local;
  
  pTVar1 = luaS_newlstr(L,"_ENV",4);
  if (9 < (pTVar1->tt & 0xf)) {
    __assert_fail("(((e)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                  ,0x4f,"void luaX_init(lua_State *)");
  }
  luaC_fix(L,(GCObject *)pTVar1);
  e._4_4_ = 0;
  while( true ) {
    if (0x16 < e._4_4_) {
      return;
    }
    pTVar1 = luaS_new(L,luaX_tokens[e._4_4_]);
    if (9 < (pTVar1->tt & 0xf)) break;
    luaC_fix(L,(GCObject *)pTVar1);
    pTVar1->extra = (char)e._4_4_ + '\x01';
    e._4_4_ = e._4_4_ + 1;
  }
  __assert_fail("(((ts)->tt) & 0x0F) < (9+1)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                ,0x52,"void luaX_init(lua_State *)");
}

Assistant:

void luaX_init (lua_State *L) {
  int i;
  TString *e = luaS_newliteral(L, LUA_ENV);  /* create env name */
  luaC_fix(L, obj2gco(e));  /* never collect this name */
  for (i=0; i<NUM_RESERVED; i++) {
    TString *ts = luaS_new(L, luaX_tokens[i]);
    luaC_fix(L, obj2gco(ts));  /* reserved words are never collected */
    ts->extra = cast_byte(i+1);  /* reserved word */
  }
}